

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_data.hpp
# Opt level: O1

LogicalType * __thiscall
duckdb::BoundParameterData::GetDefaultType
          (LogicalType *__return_storage_ptr__,BoundParameterData *this,LogicalType *type)

{
  bool bVar1;
  string local_48;
  
  if ((this->value).type_.id_ == VARCHAR) {
    StringType::GetCollation_abi_cxx11_(&local_48,(StringType *)type,type);
    bVar1 = local_48._M_string_length == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    LogicalType::LogicalType(__return_storage_ptr__,STRING_LITERAL);
  }
  else {
    LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType GetDefaultType(const LogicalType &type) {
		if (value.type().id() == LogicalTypeId::VARCHAR && StringType::GetCollation(type).empty()) {
			return LogicalTypeId::STRING_LITERAL;
		}
		return value.type();
	}